

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O2

int xmlStrncmp(xmlChar *str1,xmlChar *str2,int len)

{
  byte *pbVar1;
  int iVar2;
  long lVar3;
  
  if (str1 == str2 || len < 1) {
    return 0;
  }
  if (str1 == (xmlChar *)0x0) {
    iVar2 = -1;
  }
  else {
    if (str2 != (xmlChar *)0x0) {
      lVar3 = 0;
      while( true ) {
        pbVar1 = str2 + lVar3;
        iVar2 = (uint)str1[lVar3] - (uint)*pbVar1;
        if (iVar2 != 0) {
          return iVar2;
        }
        if (len + -1 == (int)lVar3) break;
        lVar3 = lVar3 + 1;
        if (*pbVar1 == 0) {
          return 0;
        }
      }
      return 0;
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int
xmlStrncmp(const xmlChar *str1, const xmlChar *str2, int len) {
    if (len <= 0) return(0);
    if (str1 == str2) return(0);
    if (str1 == NULL) return(-1);
    if (str2 == NULL) return(1);
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
    return(strncmp((const char *)str1, (const char *)str2, len));
#else
    do {
        int tmp = *str1++ - *str2;
        if (tmp != 0 || --len == 0) return(tmp);
    } while (*str2++ != 0);
    return 0;
#endif
}